

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::anon_unknown_36::WebSocketImpl::disconnect(WebSocketImpl *this)

{
  AsyncIoStream *pAVar1;
  WebSocketImpl *this_local;
  
  Maybe<kj::Promise<void>_>::operator=(&this->sendingControlMessage);
  this->disconnected = true;
  pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->(&this->stream);
  (*(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[6])();
  return;
}

Assistant:

void disconnect() override {
    // NOTE: While it's true that disconnect() is UB if called while a send is still in progress,
    // it would be inappropriate for us to assert !currentlySending here because currentlySending
    // remains true after a send is canceled, and it is OK to call disconnect() after canceling
    // a send.

    // If we're sending a control message (e.g. a PONG), cancel it.
    sendingControlMessage = kj::none;

    disconnected = true;
    stream->shutdownWrite();
  }